

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs5TestImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  byte bVar4;
  RegexPattern *this;
  RegExpTestCache **ppRVar5;
  RecyclerWeakReference<Js::JavascriptString> **ppRVar6;
  RecyclerWeakReference<Js::JavascriptString> *pRVar7;
  undefined4 *puVar8;
  Recycler *pRVar9;
  JavascriptLibrary *this_00;
  JavascriptLibrary *local_90;
  byte local_86;
  bool wasFound;
  uint local_6c;
  undefined1 local_68 [4];
  CharCount offset;
  byte local_5e;
  bool local_5d;
  uint local_5c;
  bool cachedResult;
  bool cacheHit;
  Type TStack_58;
  uint cacheIndex;
  JavascriptString *cachedInput;
  RegExpTestCache *cache;
  bool useCache;
  bool isSticky;
  bool isGlobal;
  GroupInfo match;
  CharCount inputLength;
  char16 *inputStr;
  RegexPattern *pattern;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  this = JavascriptRegExp::GetPattern(regularExpression);
  register0x00000000 = JavascriptString::GetString(input);
  match.offset = JavascriptString::GetLength(input);
  UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)((long)&cache + 4));
  cache._3_1_ = UnifiedRegex::RegexPattern::IsGlobal(this);
  cache._2_1_ = UnifiedRegex::RegexPattern::IsSticky(this);
  local_86 = 0;
  if ((cache._3_1_ & 1) == 0) {
    local_86 = cache._2_1_ ^ 0xff;
  }
  cache._1_1_ = local_86 & 1;
  cachedInput = (JavascriptString *)0x0;
  TStack_58.ptr = (JavascriptLibrary *)0x0;
  local_5c = 0;
  local_5d = false;
  local_5e = 0;
  if (cache._1_1_ != 0) {
    UnifiedRegex::RegexPattern::EnsureTestCache((RegexPattern *)local_68);
    ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RegExpTestCache__
                        ((WriteBarrierPtr *)local_68);
    cachedInput = (JavascriptString *)*ppRVar5;
    local_5c = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
    ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                        ((WriteBarrierPtr *)(&(cachedInput->super_RecyclableObject).type + local_5c)
                        );
    if (*ppRVar6 == (RecyclerWeakReference<Js::JavascriptString> *)0x0) {
      local_90 = (JavascriptLibrary *)0x0;
    }
    else {
      pRVar7 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_>::
               operator->((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_> *)
                          (&(cachedInput->super_RecyclableObject).type + local_5c));
      local_90 = (JavascriptLibrary *)
                 Memory::RecyclerWeakReference<Js::JavascriptString>::Get(pRVar7);
    }
    TStack_58.ptr = local_90;
    local_5d = local_90 == (JavascriptLibrary *)input;
  }
  RegexHelperTrace(scriptContext,Test,regularExpression,input);
  UnifiedRegex::RegexPattern::TraceTestCache
            ((bool)(local_5d & 1),input,(JavascriptString *)TStack_58.ptr,
             (bool)((cache._1_1_ ^ 0xff) & 1));
  if ((local_5d & 1U) != 0) {
    if ((cache._1_1_ & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2c2,"(useCache)","useCache");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    BVar3 = BVStatic<8UL>::Test((BVStatic<8UL> *)cachedInput,local_5c);
    local_5e = BVar3 != '\0';
    if ((bool)local_5e) {
      InvalidateLastMatchOnCtor(scriptContext,regularExpression,input,false);
    }
  }
  bVar2 = GetInitialOffset((bool)(cache._3_1_ & 1),(bool)(cache._2_1_ & 1),regularExpression,
                           match.offset,&local_6c);
  if (bVar2) {
    if (local_6c <= match.offset) {
      register0x00000000 =
           SimpleMatch(scriptContext,this,(char16 *)stack0xffffffffffffffc8,match.offset,local_6c);
    }
    PropagateLastMatch(scriptContext,(bool)(cache._3_1_ & 1),(bool)(cache._2_1_ & 1),
                       regularExpression,input,(GroupInfo)stack0xffffffffffffffbc,
                       (GroupInfo)stack0xffffffffffffffbc,true,true,false);
    bVar2 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)((long)&cache + 4));
    bVar4 = (bVar2 ^ 0xffU) & 1;
    if ((cache._1_1_ & 1) != 0) {
      if (local_6c != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2ea,"(offset == 0)","offset == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (((local_5d & 1U) != 0) && (TStack_58.ptr != (JavascriptLibrary *)input)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2eb,"(!cacheHit || cachedInput == input)",
                                    "!cacheHit || cachedInput == input");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (((local_5d & 1U) != 0) && ((local_5e & 1) != bVar4)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2ec,"(!cacheHit || cachedResult == wasFound)",
                                    "!cacheHit || cachedResult == wasFound");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)regularExpression);
      pRVar7 = Memory::Recycler::CreateWeakReferenceHandle<Js::JavascriptString>(pRVar9,input);
      Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_>::operator=
                ((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_> *)
                 (&(cachedInput->super_RecyclableObject).type + local_5c),pRVar7);
      if (bVar4 == 0) {
        BVStatic<8UL>::Clear((BVStatic<8UL> *)cachedInput,local_5c);
      }
      else {
        BVStatic<8UL>::Set((BVStatic<8UL> *)cachedInput,local_5c);
      }
    }
    scriptContext_local = (ScriptContext *)JavascriptBoolean::ToVar((uint)bVar4,scriptContext);
  }
  else {
    if ((cache._1_1_ & 1) != 0) {
      if (local_6c != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d7,"(offset == 0)","offset == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (((local_5d & 1U) != 0) && (TStack_58.ptr != (JavascriptLibrary *)input)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d8,"(!cacheHit || cachedInput == input)",
                                    "!cacheHit || cachedInput == input");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (((local_5d & 1U) != 0) && ((local_5e & 1) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d9,"(!cacheHit || cachedResult == false)",
                                    "!cacheHit || cachedResult == false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)regularExpression);
      pRVar7 = Memory::Recycler::CreateWeakReferenceHandle<Js::JavascriptString>(pRVar9,input);
      Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_>::operator=
                ((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_> *)
                 (&(cachedInput->super_RecyclableObject).type + local_5c),pRVar7);
      BVStatic<8UL>::Clear((BVStatic<8UL> *)cachedInput,local_5c);
    }
    this_00 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)JavascriptLibraryBase::GetFalse(&this_00->super_JavascriptLibraryBase);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::RegexEs5TestImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        UnifiedRegex::GroupInfo match; // initially undefined

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        const bool useCache = !isGlobal && !isSticky;

        UnifiedRegex::RegExpTestCache* cache = nullptr;
        JavascriptString * cachedInput = nullptr;
        uint cacheIndex = 0;
        bool cacheHit = false;
        bool cachedResult = false;
        if (useCache)
        {
            cache = pattern->EnsureTestCache();
            cacheIndex = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
            cachedInput = cache->inputArray[cacheIndex] != nullptr ? cache->inputArray[cacheIndex]->Get() : nullptr;
            cacheHit = cachedInput == input;
        }
#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Test, regularExpression, input);
        UnifiedRegex::RegexPattern::TraceTestCache(cacheHit, input, cachedInput, !useCache);
#endif

        if (cacheHit)
        {
            Assert(useCache);
            cachedResult = (cache->resultBV.Test(cacheIndex) != 0);

            // If our cache says this test should produce a match (which we aren't going to compute),
            // notify the Ctor to invalidate the last match so it must be recomputed before access.
            if (cachedResult)
            {
                InvalidateLastMatchOnCtor(scriptContext, regularExpression, input);
            }

            // for debug builds, let's still do the real test so we can validate values in the cache
#if !DBG
            return JavascriptBoolean::ToVar(cachedResult, scriptContext);
#endif
        }

        CharCount offset;
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            if (useCache)
            {
                Assert(offset == 0);
                Assert(!cacheHit || cachedInput == input);
                Assert(!cacheHit || cachedResult == false);
                cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
                cache->resultBV.Clear(cacheIndex);
            }
            return scriptContext->GetLibrary()->GetFalse();
        }
        if (offset <= inputLength)
        {
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);
        bool wasFound = !match.IsUndefined();

        if (useCache)
        {
            Assert(offset == 0);
            Assert(!cacheHit || cachedInput == input);
            Assert(!cacheHit || cachedResult == wasFound);
            cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
            if (wasFound)
            {
                cache->resultBV.Set(cacheIndex);
            }
            else
            {
                cache->resultBV.Clear(cacheIndex);
            }
        }
        return JavascriptBoolean::ToVar(wasFound, scriptContext);
    }